

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  unsigned_short *puVar6;
  float fVar7;
  float fVar8;
  ImWchar IVar9;
  undefined2 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImFontGlyph *pIVar14;
  ImFontGlyph *pIVar15;
  ulong uVar16;
  float *pfVar17;
  char *__function;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  
  uVar23 = (this->Glyphs).Size;
  if ((ulong)uVar23 == 0) {
    uVar20 = 1;
  }
  else {
    lVar18 = 0;
    uVar22 = 0;
    if (0 < (int)uVar23) {
      uVar22 = uVar23;
    }
    uVar20 = 0;
    do {
      if (uVar22 <= uVar23 - 1) {
        __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
        goto LAB_0013f55a;
      }
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar18);
      if (uVar20 <= uVar1) {
        uVar20 = (uint)uVar1;
      }
      lVar18 = lVar18 + 0x28;
    } while ((ulong)uVar23 * 0x28 != lVar18);
    uVar20 = uVar20 + 1;
  }
  if (0xfffe < (int)uVar23) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                  ,0x9e0,"void ImFont::BuildLookupTable()");
  }
  pfVar5 = (this->IndexAdvanceX).Data;
  if (pfVar5 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar5);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar6 = (this->IndexLookup).Data;
  if (puVar6 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar6);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  GrowIndex(this,uVar20);
  iVar2 = (this->Glyphs).Size;
  lVar18 = (long)iVar2;
  if (0 < lVar18) {
    iVar3 = (this->IndexAdvanceX).Size;
    pfVar5 = (this->IndexAdvanceX).Data;
    iVar4 = (this->IndexLookup).Size;
    puVar6 = (this->IndexLookup).Data;
    pfVar17 = &((this->Glyphs).Data)->AdvanceX;
    lVar21 = 0;
    do {
      if (iVar3 <= (int)(uint)((ImFontGlyph *)(pfVar17 + -1))->Codepoint) goto LAB_0013f517;
      uVar23 = (uint)((ImFontGlyph *)(pfVar17 + -1))->Codepoint;
      pfVar5[uVar23] = *pfVar17;
      if (iVar4 <= (int)uVar23) goto LAB_0013f52e;
      puVar6[uVar23] = (unsigned_short)lVar21;
      lVar21 = lVar21 + 1;
      pfVar17 = pfVar17 + 10;
    } while (lVar18 != lVar21);
  }
  if (((this->IndexLookup).Size < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)
     ) {
    pIVar15 = this->FallbackGlyph;
  }
  else {
    pIVar15 = (ImFontGlyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28))
    ;
  }
  if (pIVar15 == (ImFontGlyph *)0x0) {
LAB_0013f49c:
    if ((int)(uint)this->FallbackChar < (this->IndexLookup).Size) {
      uVar1 = (this->IndexLookup).Data[this->FallbackChar];
      pIVar15 = (ImFontGlyph *)0x0;
      if (uVar1 != 0xffff) {
        pIVar15 = (ImFontGlyph *)
                  ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
      }
    }
    else {
      pIVar15 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar15;
    fVar24 = 0.0;
    if (pIVar15 != (ImFontGlyph *)0x0) {
      fVar24 = pIVar15->AdvanceX;
    }
    this->FallbackAdvanceX = fVar24;
    uVar23 = (this->IndexAdvanceX).Size;
    pfVar5 = (this->IndexAdvanceX).Data;
    uVar19 = 0;
    uVar16 = (ulong)uVar23;
    if ((int)uVar23 < 1) {
      uVar16 = uVar19;
    }
    while (uVar16 != uVar19) {
      pfVar17 = pfVar5 + uVar19;
      if (*pfVar17 <= 0.0 && *pfVar17 != 0.0) {
        pfVar5[uVar19] = this->FallbackAdvanceX;
      }
      uVar19 = uVar19 + 1;
      if (uVar20 == uVar19) {
        return;
      }
    }
  }
  else {
    if (iVar2 < 1) {
LAB_0013f564:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4f0,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    if ((this->Glyphs).Data[lVar18 + -1].Codepoint != 9) {
      uVar23 = iVar2 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= iVar2) {
        if (iVar3 == 0) {
          uVar22 = 8;
        }
        else {
          uVar22 = iVar3 / 2 + iVar3;
        }
        if ((int)uVar22 <= (int)uVar23) {
          uVar22 = uVar23;
        }
        if (iVar3 < (int)uVar22) {
          pIVar14 = (ImFontGlyph *)ImGui::MemAlloc((ulong)uVar22 * 0x28);
          pIVar15 = (this->Glyphs).Data;
          if (pIVar15 != (ImFontGlyph *)0x0) {
            memcpy(pIVar14,pIVar15,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar14;
          (this->Glyphs).Capacity = uVar22;
        }
      }
      (this->Glyphs).Size = uVar23;
    }
    lVar18 = (long)(this->Glyphs).Size;
    if (lVar18 < 1) goto LAB_0013f564;
    pIVar15 = (this->Glyphs).Data;
    if (((this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar14 = this->FallbackGlyph;
    }
    else {
      pIVar14 = (ImFontGlyph *)
                ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    fVar24 = pIVar14->V1;
    pIVar15[lVar18 + -1].U1 = pIVar14->U1;
    pIVar15[lVar18 + -1].V1 = fVar24;
    IVar9 = pIVar14->Codepoint;
    uVar10 = *(undefined2 *)&pIVar14->field_0x2;
    fVar11 = pIVar14->AdvanceX;
    fVar12 = pIVar14->X0;
    fVar13 = pIVar14->Y0;
    fVar24 = pIVar14->Y1;
    fVar7 = pIVar14->U0;
    fVar8 = pIVar14->V0;
    pIVar15[lVar18 + -1].X1 = pIVar14->X1;
    pIVar15[lVar18 + -1].Y1 = fVar24;
    pIVar15[lVar18 + -1].U0 = fVar7;
    pIVar15[lVar18 + -1].V0 = fVar8;
    pIVar14 = pIVar15 + lVar18 + -1;
    pIVar14->Codepoint = IVar9;
    *(undefined2 *)&pIVar14->field_0x2 = uVar10;
    pIVar14->AdvanceX = fVar11;
    pIVar15[lVar18 + -1].X0 = fVar12;
    pIVar15[lVar18 + -1].Y0 = fVar13;
    pIVar15[lVar18 + -1].Codepoint = 9;
    fVar24 = pIVar15[lVar18 + -1].AdvanceX * 4.0;
    pIVar15[lVar18 + -1].AdvanceX = fVar24;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar24;
      if ((this->IndexLookup).Size < 10) {
LAB_0013f52e:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_0013f55a;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_0013f49c;
    }
  }
LAB_0013f517:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_0013f55a:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4e6,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}